

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

OptionStatus
setLocalOptionValue(HighsLogOptions *report_log_options,string *name,HighsLogOptions *log_options,
                   vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
                   string *value_passed)

{
  HighsOptionType HVar1;
  OptionRecordString *option;
  _Alloc_hider __s;
  bool bVar2;
  OptionStatus OVar3;
  int iVar4;
  OptionStatus OVar5;
  uint uVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  double value;
  double dVar10;
  HighsInt index;
  string value_trim;
  bool value_bool;
  double local_a0;
  int scanned_num_char;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&value_trim,(string *)value_passed);
  std::__cxx11::string::string((string *)&value_bool," ",(allocator *)&index);
  trim(&value_trim,(string *)&value_bool);
  std::__cxx11::string::~string((string *)&value_bool);
  OVar3 = getOptionIndex(report_log_options,name,option_records,&index);
  OVar5 = kUnknownOption;
  if (OVar3 != kOk) goto LAB_0026a35c;
  lVar9 = (long)index;
  HVar1 = (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
          _M_impl.super__Vector_impl_data._M_start[lVar9]->type;
  if (HVar1 == kDouble) {
    tolower((int)&value_trim);
    bVar2 = std::operator==(&value_trim,"inf");
    value = INFINITY;
    if (!bVar2) {
      bVar2 = std::operator==(&value_trim,"+inf");
      value = INFINITY;
      if (!bVar2) {
        bVar2 = std::operator==(&value_trim,"-inf");
        if (bVar2) {
          value = -INFINITY;
        }
        else {
          lVar7 = std::__cxx11::string::find_first_not_of((char *)&value_trim,0x3a6b6e);
          if (lVar7 != -1) goto LAB_0026a623;
          uVar6 = atoi(value_trim._M_dataplus._M_p);
          value = atof(value_trim._M_dataplus._M_p);
          dVar10 = (double)(int)uVar6;
          if ((value == dVar10) && (!NAN(value) && !NAN(dVar10))) {
            local_a0 = value;
            highsLogDev(report_log_options,kInfo,
                        "setLocalOptionValue: Value = \"%s\" converts via atoi as %d so is %g as double, and %g via atof\n"
                        ,dVar10,value,value_trim._M_dataplus._M_p,(ulong)uVar6);
            value = local_a0;
          }
        }
      }
    }
    OVar5 = setLocalOptionValue(report_log_options,
                                (OptionRecordDouble *)
                                (option_records->
                                super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)
                                ._M_impl.super__Vector_impl_data._M_start[lVar9],value);
  }
  else {
    if (HVar1 == kInt) {
      lVar7 = std::__cxx11::string::find_first_not_of((char *)&value_trim,0x3a6af3);
      __s = value_trim._M_dataplus;
      if (lVar7 == -1) {
        __isoc99_sscanf(value_trim._M_dataplus._M_p,"%d%n",&value_bool,&scanned_num_char);
        sVar8 = strlen(__s._M_p);
        if (scanned_num_char == (int)sVar8) {
          OVar5 = setLocalOptionValue(report_log_options,
                                      (OptionRecordInt *)
                                      (option_records->
                                      super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>
                                      )._M_impl.super__Vector_impl_data._M_start[lVar9],_value_bool)
          ;
          goto LAB_0026a35c;
        }
        highsLogDev(report_log_options,kError,
                    "setLocalOptionValue: Value = \"%s\" converts via sscanf as %d by scanning %d of %d characters\n"
                    ,value_trim._M_dataplus._M_p,(ulong)_value_bool,(ulong)(uint)scanned_num_char,
                    (int)sVar8);
      }
    }
    else {
      if (HVar1 != kBool) {
        iVar4 = std::__cxx11::string::compare((string *)name);
        if (iVar4 == 0) {
          std::__cxx11::string::string
                    ((string *)&value_bool,
                     (string *)
                     (option_records->
                     super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar9][1]._vptr_OptionRecord);
          iVar4 = std::__cxx11::string::compare((string *)value_passed);
          if (iVar4 != 0) {
            std::__cxx11::string::string((string *)&local_70,(string *)value_passed);
            highsOpenLogFile(log_options,option_records,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
          }
          std::__cxx11::string::~string((string *)&value_bool);
        }
        iVar4 = std::__cxx11::string::compare((string *)name);
        if (iVar4 == 0) {
          highsLogUser(report_log_options,kError,
                       "setLocalOptionValue: model filename cannot be set\n");
        }
        else {
          option = (OptionRecordString *)
                   (option_records->
                   super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar9];
          std::__cxx11::string::string((string *)&local_90,(string *)value_passed);
          OVar5 = setLocalOptionValue(report_log_options,option,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
        }
        goto LAB_0026a35c;
      }
      std::__cxx11::string::string((string *)&local_50,(string *)&value_trim);
      bVar2 = boolFromString(&local_50,&value_bool);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar2) {
        *(bool *)(option_records->
                 super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar9][1]._vptr_OptionRecord = value_bool;
        OVar5 = kOk;
        goto LAB_0026a35c;
      }
      highsLogUser(report_log_options,kError,
                   "setLocalOptionValue: Value \"%s\" cannot be interpreted as a bool\n",
                   value_trim._M_dataplus._M_p);
    }
LAB_0026a623:
    OVar5 = kIllegalValue;
  }
LAB_0026a35c:
  std::__cxx11::string::~string((string *)&value_trim);
  return OVar5;
}

Assistant:

OptionStatus setLocalOptionValue(const HighsLogOptions& report_log_options,
                                 const std::string& name,
                                 HighsLogOptions& log_options,
                                 std::vector<OptionRecord*>& option_records,
                                 const std::string value_passed) {
  // Trim any leading and trailing spaces
  std::string value_trim = value_passed;
  trim(value_trim, " ");
  HighsInt index;
  OptionStatus status =
      getOptionIndex(report_log_options, name, option_records, index);
  if (status != OptionStatus::kOk) return status;
  HighsOptionType type = option_records[index]->type;
  if (type == HighsOptionType::kBool) {
    bool value_bool;
    bool return_status = boolFromString(value_trim, value_bool);
    if (!return_status) {
      highsLogUser(
          report_log_options, HighsLogType::kError,
          "setLocalOptionValue: Value \"%s\" cannot be interpreted as a bool\n",
          value_trim.c_str());
      return OptionStatus::kIllegalValue;
    }
    return setLocalOptionValue(((OptionRecordBool*)option_records[index])[0],
                               value_bool);
  } else if (type == HighsOptionType::kInt) {
    // Check that the string only contains legitimate characters
    if (value_trim.find_first_not_of("+-0123456789eE") != std::string::npos)
      return OptionStatus::kIllegalValue;
    HighsInt value_int;
    int scanned_num_char;
    const char* value_char = value_trim.c_str();
    sscanf(value_char, "%" HIGHSINT_FORMAT "%n", &value_int, &scanned_num_char);
    const int value_num_char = strlen(value_char);
    // Check that all characters in value_char are scanned by the format
    const bool converted_ok = scanned_num_char == value_num_char;
    if (!converted_ok) {
      highsLogDev(report_log_options, HighsLogType::kError,
                  "setLocalOptionValue: Value = \"%s\" converts via sscanf as "
                  "%" HIGHSINT_FORMAT
                  " "
                  "by scanning %" HIGHSINT_FORMAT " of %" HIGHSINT_FORMAT
                  " characters\n",
                  value_trim.c_str(), value_int, scanned_num_char,
                  value_num_char);
      return OptionStatus::kIllegalValue;
    }
    return setLocalOptionValue(report_log_options,
                               ((OptionRecordInt*)option_records[index])[0],
                               value_int);
  } else if (type == HighsOptionType::kDouble) {
    // Check that the string only contains legitimate characters -
    // after handling +/- inf
    double value_double = 0;
    tolower(value_trim);
    if (value_trim == "inf" || value_trim == "+inf") {
      value_double = kHighsInf;
    } else if (value_trim == "-inf") {
      value_double = -kHighsInf;
    } else {
      if (value_trim.find_first_not_of("+-.0123456789eE") != std::string::npos)
        return OptionStatus::kIllegalValue;
      HighsInt value_int = atoi(value_trim.c_str());
      value_double = atof(value_trim.c_str());
      double value_int_double = value_int;
      if (value_double == value_int_double) {
        highsLogDev(report_log_options, HighsLogType::kInfo,
                    "setLocalOptionValue: Value = \"%s\" converts via atoi as "
                    "%" HIGHSINT_FORMAT
                    " "
                    "so is %g as double, and %g via atof\n",
                    value_trim.c_str(), value_int, value_int_double,
                    value_double);
      }
    }
    return setLocalOptionValue(report_log_options,
                               ((OptionRecordDouble*)option_records[index])[0],
                               value_double);
  } else {
    // Setting a string option value
    if (!name.compare(kLogFileString)) {
      OptionRecordString& option = *(OptionRecordString*)option_records[index];
      std::string original_log_file = *(option.value);
      if (value_passed.compare(original_log_file)) {
        // Changing the name of the log file
        highsOpenLogFile(log_options, option_records, value_passed);
      }
    }
    if (!name.compare(kModelFileString)) {
      // Don't allow model filename to be changed - it's only an
      // option so that reading of run-time options works
      highsLogUser(report_log_options, HighsLogType::kError,
                   "setLocalOptionValue: model filename cannot be set\n");
      return OptionStatus::kUnknownOption;
    } else {
      return setLocalOptionValue(
          report_log_options, ((OptionRecordString*)option_records[index])[0],
          value_passed);
    }
  }
}